

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O2

void Min_SopDist1Merge(Min_Man_t *p)

{
  Min_Cube_t **ppMVar1;
  int iVar2;
  uint uVar3;
  Min_Cube_t *pCube;
  long lVar4;
  Min_Cube_t *in_RDX;
  Min_Cube_t *extraout_RDX;
  uint uVar5;
  Min_Cube_t *pCube0;
  Min_Cube_t *pCube1;
  
  uVar5 = p->nVars;
  do {
    if ((int)uVar5 < 0) {
      return;
    }
    pCube0 = (Min_Cube_t *)(p->ppStore + uVar5);
    while (pCube0 = pCube0->pNext, pCube1 = pCube0, pCube0 != (Min_Cube_t *)0x0) {
      while (pCube1 = pCube1->pNext, pCube1 != (Min_Cube_t *)0x0) {
        if (0x3fffff < (*(uint *)&pCube1->field_0x8 ^ *(uint *)&pCube0->field_0x8)) {
          __assert_fail("pCube->nLits == pCube2->nLits",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                        ,0x1f7,"void Min_SopDist1Merge(Min_Man_t *)");
        }
        iVar2 = Min_CubesDistOne(pCube0,pCube1,in_RDX);
        in_RDX = extraout_RDX;
        if (iVar2 != 0) {
          if (((*(uint *)&pCube1->field_0x8 ^ *(uint *)&pCube0->field_0x8) & 0x3ff) != 0) {
            __assert_fail("pCube0->nVars == pCube1->nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covInt.h"
                          ,0x1e3,"Min_Cube_t *Min_CubesXor(Min_Man_t *, Min_Cube_t *, Min_Cube_t *)"
                         );
          }
          pCube = Min_CubeAlloc(p);
          for (lVar4 = 0; lVar4 < p->nWords; lVar4 = lVar4 + 1) {
            pCube->uData[lVar4] = pCube1->uData[lVar4] ^ pCube0->uData[lVar4];
          }
          uVar3 = Min_CubeCountLits(pCube);
          *(uint *)&pCube->field_0x8 = *(uint *)&pCube->field_0x8 & 0x3fffff | uVar3 << 0x16;
          uVar3 = uVar3 & 0x3ff;
          if (uVar3 != (*(uint *)&pCube0->field_0x8 >> 0x16) - 1) {
            __assert_fail("pCubeNew->nLits == pCube->nLits - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/cov/covMinSop.c"
                          ,0x1fb,"void Min_SopDist1Merge(Min_Man_t *)");
          }
          ppMVar1 = p->ppStore;
          in_RDX = ppMVar1[uVar3];
          pCube->pNext = in_RDX;
          ppMVar1[uVar3] = pCube;
          p->nCubes = p->nCubes + 1;
        }
      }
    }
    uVar5 = uVar5 - 1;
  } while( true );
}

Assistant:

void Min_SopDist1Merge( Min_Man_t * p )
{
    Min_Cube_t * pCube, * pCube2, * pCubeNew;
    int i;
    for ( i = p->nVars; i >= 0; i-- )
    {
        Min_CoverForEachCube( p->ppStore[i], pCube )
        Min_CoverForEachCube( pCube->pNext, pCube2 )
        {
            assert( pCube->nLits == pCube2->nLits );
            if ( !Min_CubesDistOne( pCube, pCube2, NULL ) )
                continue;
            pCubeNew = Min_CubesXor( p, pCube, pCube2 );
            assert( pCubeNew->nLits == pCube->nLits - 1 );
            pCubeNew->pNext = p->ppStore[pCubeNew->nLits];
            p->ppStore[pCubeNew->nLits] = pCubeNew;
            p->nCubes++;
        }
    }
}